

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::ArenaTest_SpaceAllocated_and_Used_Test::TestBody
          (ArenaTest_SpaceAllocated_and_Used_Test *this)

{
  CachedBlock ***this_00;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_400;
  Message local_3f8;
  uint64_t local_3f0;
  int local_3e4;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_11;
  Message local_3c8;
  uint64_t local_3c0;
  uint64_t local_3b8;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_10;
  Message local_398;
  uint64_t local_390;
  int local_384;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_9;
  Message local_368;
  uint64_t local_360;
  int local_354;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_8;
  Message local_338;
  uint64_t local_330;
  int local_324;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_7;
  Message local_308;
  uint64_t local_300;
  int local_2f4;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_6;
  Arena arena_2;
  ArenaOptions options;
  undefined1 local_200 [8];
  vector<char,_std::allocator<char>_> arena_block;
  Message local_1e0;
  uint64_t local_1d8;
  int local_1cc;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_5;
  Message local_1b0;
  uint64_t local_1a8;
  uint64_t local_1a0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_4;
  Message local_180;
  uint64_t local_178;
  int local_16c;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_3;
  Message local_150;
  uint64_t local_148;
  int local_13c;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_2;
  Message local_120;
  uint64_t local_118;
  int local_10c;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_1;
  Message local_f0 [3];
  uint64_t local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  Arena arena_1;
  ArenaTest_SpaceAllocated_and_Used_Test *this_local;
  
  Arena::Arena((Arena *)&gtest_ar.message_);
  local_cc = 0;
  local_d8 = Arena::SpaceAllocated((Arena *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_c8,"0","arena_1.SpaceAllocated()",&local_cc,&local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x672,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  local_10c = 0;
  local_118 = Arena::SpaceUsed((Arena *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_108,"0","arena_1.SpaceUsed()",&local_10c,&local_118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x673,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  local_13c = 0;
  local_148 = Arena::Reset((Arena *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_138,"0","arena_1.Reset()",&local_13c,&local_148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x674,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  Arena::CreateArray<char>((Arena *)&gtest_ar.message_,0x140);
  local_16c = 0x140;
  local_178 = Arena::SpaceAllocated((Arena *)&gtest_ar.message_);
  testing::internal::CmpHelperLE<int,unsigned_long>
            ((internal *)local_168,"320","arena_1.SpaceAllocated()",&local_16c,&local_178);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x677,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  local_1a0 = Align8(0x140);
  local_1a8 = Arena::SpaceUsed((Arena *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_198,"Align8(320)","arena_1.SpaceUsed()",&local_1a0,&local_1a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x678,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  local_1cc = 0x140;
  local_1d8 = Arena::Reset((Arena *)&gtest_ar.message_);
  testing::internal::CmpHelperLE<int,unsigned_long>
            ((internal *)local_1c8,"320","arena_1.Reset()",&local_1cc,&local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &arena_block.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x679,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &arena_block.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
               &local_1e0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &arena_block.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_200,0x400,
             (allocator_type *)((long)&options.block_dealloc + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&options.block_dealloc + 7));
  this_00 = &arena_2.impl_.first_arena_.cached_blocks_;
  ArenaOptions::ArenaOptions((ArenaOptions *)this_00);
  arena_2.impl_.first_arena_.cached_blocks_ = (CachedBlock **)0x100;
  options.start_block_size = 0x2000;
  options.max_block_size =
       (size_t)std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_200,0);
  options.initial_block =
       (char *)std::vector<char,_std::allocator<char>_>::size
                         ((vector<char,_std::allocator<char>_> *)local_200);
  Arena::Arena((Arena *)&gtest_ar_6.message_,(ArenaOptions *)this_00);
  local_2f4 = 0x400;
  local_300 = Arena::SpaceAllocated((Arena *)&gtest_ar_6.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_2f0,"1024","arena_2.SpaceAllocated()",&local_2f4,&local_300);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar1) {
    testing::Message::Message(&local_308);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x683,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  local_324 = 0;
  local_330 = Arena::SpaceUsed((Arena *)&gtest_ar_6.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_320,"0","arena_2.SpaceUsed()",&local_324,&local_330);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x684,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  local_354 = 0x400;
  local_360 = Arena::Reset((Arena *)&gtest_ar_6.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_350,"1024","arena_2.Reset()",&local_354,&local_360);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(&local_368);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x685,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_368);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  Arena::CreateArray<char>((Arena *)&gtest_ar_6.message_,0x37);
  local_384 = 0x400;
  local_390 = Arena::SpaceAllocated((Arena *)&gtest_ar_6.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_380,"1024","arena_2.SpaceAllocated()",&local_384,&local_390);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
  if (!bVar1) {
    testing::Message::Message(&local_398);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x687,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_398);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  local_3b8 = Align8(0x37);
  local_3c0 = Arena::SpaceUsed((Arena *)&gtest_ar_6.message_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_3b0,"Align8(55)","arena_2.SpaceUsed()",&local_3b8,&local_3c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
  if (!bVar1) {
    testing::Message::Message(&local_3c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x688,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_3c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
  local_3e4 = 0x400;
  local_3f0 = Arena::Reset((Arena *)&gtest_ar_6.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_3e0,"1024","arena_2.Reset()",&local_3e4,&local_3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
  if (!bVar1) {
    testing::Message::Message(&local_3f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_400,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x689,pcVar2);
    testing::internal::AssertHelper::operator=(&local_400,&local_3f8);
    testing::internal::AssertHelper::~AssertHelper(&local_400);
    testing::Message::~Message(&local_3f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
  Arena::~Arena((Arena *)&gtest_ar_6.message_);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)local_200);
  Arena::~Arena((Arena *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(ArenaTest, SpaceAllocated_and_Used) {
  Arena arena_1;
  EXPECT_EQ(0, arena_1.SpaceAllocated());
  EXPECT_EQ(0, arena_1.SpaceUsed());
  EXPECT_EQ(0, arena_1.Reset());
  Arena::CreateArray<char>(&arena_1, 320);
  // Arena will allocate slightly more than 320 for the block headers.
  EXPECT_LE(320, arena_1.SpaceAllocated());
  EXPECT_EQ(Align8(320), arena_1.SpaceUsed());
  EXPECT_LE(320, arena_1.Reset());

  // Test with initial block.
  std::vector<char> arena_block(1024);
  ArenaOptions options;
  options.start_block_size = 256;
  options.max_block_size = 8192;
  options.initial_block = &arena_block[0];
  options.initial_block_size = arena_block.size();
  Arena arena_2(options);
  EXPECT_EQ(1024, arena_2.SpaceAllocated());
  EXPECT_EQ(0, arena_2.SpaceUsed());
  EXPECT_EQ(1024, arena_2.Reset());
  Arena::CreateArray<char>(&arena_2, 55);
  EXPECT_EQ(1024, arena_2.SpaceAllocated());
  EXPECT_EQ(Align8(55), arena_2.SpaceUsed());
  EXPECT_EQ(1024, arena_2.Reset());
}